

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_get_node_single_low(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_sl_node_t *piVar2;
  ion_sl_node_t *node;
  char cStack_60;
  int search;
  ion_status_t status;
  int key;
  ion_byte_t str [10];
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  initialize_skiplist_std_conditions((ion_skiplist_t *)(str + 2));
  strcpy((char *)((long)&status.count + 2),"find this");
  status.error = '\x03';
  status._1_3_ = 0;
  _cStack_60 = sl_insert((ion_skiplist_t *)(str + 2),&status,(ion_value_t)((long)&status.count + 2))
  ;
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(cStack_60 == '\0'),0x1ad,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(search == 1),0x1ae,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  node._4_4_ = 2;
  piVar2 = sl_find_node((ion_skiplist_t *)(str + 2),(ion_key_t)((long)&node + 4));
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(piVar2 == (ion_sl_node_t *)skiplist.super._24_8_),0x1b7,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  sl_destroy((ion_skiplist_t *)(str + 2));
  return;
}

Assistant:

void
test_skiplist_get_node_single_low(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t str[10];

	strcpy((char *) str, "find this");

	int key				= 3;

	ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, str);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	int				search	= 2;
	ion_sl_node_t	*node	= sl_find_node(&skiplist, (ion_key_t) &search);

	PLANCK_UNIT_ASSERT_TRUE(tc, node == skiplist.head);

	sl_destroy(&skiplist);
}